

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall MarrayTest::resizeTest<(andres::CoordinateOrder)1>(MarrayTest *this)

{
  allocator<unsigned_long> *this_00;
  allocator<int> *paVar1;
  reference pvVar2;
  iterator iVar3;
  iterator iVar4;
  size_t sVar5;
  reference piVar6;
  bool local_1229;
  bool local_11d9;
  bool local_1199;
  bool local_1111;
  bool local_10c9;
  bool local_1071;
  bool local_1021;
  bool local_fe9;
  bool local_f69;
  bool local_f29;
  bool local_ed1;
  bool local_e71;
  bool local_e31;
  bool local_de9;
  bool local_db9;
  bool local_d59;
  bool local_d22;
  bool local_d21;
  int local_d20;
  int local_d1c;
  int x_5;
  int y_5;
  unsigned_long *local_d10;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_d08;
  allocator<unsigned_long> local_cf9;
  undefined1 local_cf8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape_9;
  undefined1 local_cc8 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_18;
  undefined1 local_c78 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_17;
  bool local_c55;
  int i_5;
  bool local_c4d;
  int i_4;
  unsigned_long *local_c48;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_c40;
  allocator<unsigned_long> local_c31;
  undefined1 local_c30 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape_8;
  undefined1 local_c00 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_17;
  undefined1 local_bb0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_16;
  allocator<unsigned_long> local_b79;
  undefined1 local_b78 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape_7;
  undefined1 local_b48 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_16;
  undefined1 local_af8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_15;
  allocator<unsigned_long> local_ac1;
  undefined1 local_ac0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape_6;
  undefined1 local_a90 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_15;
  undefined1 local_a40 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_14;
  int local_a20;
  int x_4;
  int y_4;
  int z_3;
  unsigned_long *local_a10;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a08;
  allocator<int> local_9fd;
  CoordinateOrder local_9fc;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_9f8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_9f0;
  undefined1 local_9e8 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_14;
  undefined1 local_998 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_13;
  allocator<int> local_965;
  CoordinateOrder local_964;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_960;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_958;
  undefined1 local_950 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_13;
  undefined1 local_900 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_12;
  int local_8e0;
  int x_3;
  int y_3;
  int z_2;
  unsigned_long *local_8d0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_8c8;
  allocator<unsigned_long> local_8b9;
  undefined1 local_8b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape_5;
  undefined1 local_888 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_12;
  undefined1 local_838 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_11;
  bool local_815;
  int i_3;
  bool local_80d;
  int i_2;
  unsigned_long *local_808;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_800;
  allocator<unsigned_long> local_7f1;
  undefined1 local_7f0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape_4;
  undefined1 local_7c0 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_11;
  undefined1 local_770 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_10;
  allocator<unsigned_long> local_739;
  undefined1 local_738 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape_3;
  undefined1 local_708 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_10;
  undefined1 local_6b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_9;
  allocator<unsigned_long> local_681;
  undefined1 local_680 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape_2;
  undefined1 local_650 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_9;
  undefined1 local_600 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_8;
  int local_5e0;
  int local_5dc;
  int x_2;
  int y_2;
  unsigned_long *local_5d0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_5c8;
  allocator<int> local_5bd;
  CoordinateOrder local_5bc;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_5b8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_5b0;
  undefined1 local_5a8 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_8;
  undefined1 local_558 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_7;
  allocator<int> local_525;
  CoordinateOrder local_524;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_520;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_518;
  undefined1 local_510 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_7;
  undefined1 local_4c0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_6;
  int local_4a0;
  int x_1;
  int y_1;
  int z_1;
  unsigned_long *local_490;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_488;
  allocator<unsigned_long> local_479;
  undefined1 local_478 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape_1;
  undefined1 local_448 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_6;
  undefined1 local_3f8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_5;
  int local_3d8;
  int x;
  int y;
  int z;
  unsigned_long *local_3c8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3c0;
  allocator<unsigned_long> local_3b1;
  undefined1 local_3b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> newShape;
  undefined1 local_390 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_5;
  bool local_33e;
  bool local_33d;
  int scalar_1;
  bool local_335;
  int i_1;
  unsigned_long *local_330;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_328;
  allocator<int> local_31d;
  CoordinateOrder local_31c;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_318;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_310;
  undefined1 local_308 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_4;
  undefined1 local_2b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_4;
  bool local_296;
  bool local_295;
  int i;
  unsigned_long *local_290;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_288;
  allocator<int> local_279;
  undefined1 local_278 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_3;
  undefined1 local_228 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_3;
  bool local_205;
  int scalar;
  unsigned_long *local_200;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1f8;
  allocator<int> local_1ed;
  CoordinateOrder local_1ec;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1e8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1e0;
  undefined1 local_1d8 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_2;
  undefined1 local_188 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  allocator<int> local_155;
  CoordinateOrder local_154;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_150;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_148;
  undefined1 local_140 [8];
  Marray<int,_std::allocator<unsigned_long>_> m_1;
  undefined1 local_f0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape0;
  undefined1 local_d0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  allocator<int> local_9d;
  CoordinateOrder local_9c;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_98;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_90;
  undefined1 local_88 [8];
  Marray<int,_std::allocator<unsigned_long>_> m;
  allocator<unsigned_long> local_29;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  MarrayTest *this_local;
  
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_long>::allocator(&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1,&local_29);
  std::allocator<unsigned_long>::~allocator(&local_29);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar2 = 0x18;
  local_90._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  local_98._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  local_9c = LastMajorOrder;
  std::allocator<int>::allocator(&local_9d);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_88,local_90,local_98,&this->scalar_,
             &local_9c,&local_9d);
  std::allocator<int>::~allocator(&local_9d);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar2 = 0xc;
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0xc;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_88,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (int *)((long)&shape_1.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_88,0);
  local_d59 = false;
  if (sVar5 == 0xc) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_88);
    local_d59 = false;
    if (sVar5 == 0xc) {
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_88);
      local_d59 = sVar5 == 1;
    }
  }
  shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = local_d59;
  test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_88);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  this_00 = (allocator<unsigned_long> *)
            ((long)&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                    .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,1,this_00);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&shape0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_1.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0,0,
             (allocator_type *)&m_1.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_1.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0,0);
  *pvVar2 = 0x18;
  local_148._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
  local_150._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
  local_154 = LastMajorOrder;
  std::allocator<int>::allocator(&local_155);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_140,local_148,local_150,
             &this->scalar_,&local_154,&local_155);
  std::allocator<int>::~allocator(&local_155);
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
  shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_140,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (int *)((long)&shape_2.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_140);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d0);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_2.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188,1,
             (allocator_type *)&m_2.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_2.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188,0);
  *pvVar2 = 0x18;
  local_1e0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188);
  local_1e8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188);
  local_1ec = LastMajorOrder;
  std::allocator<int>::allocator(&local_1ed);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_1d8,local_1e0,local_1e8,
             &this->scalar_,&local_1ec,&local_1ed);
  std::allocator<int>::~allocator(&local_1ed);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188,0);
  *pvVar2 = 1;
  local_1f8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188);
  local_200 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188);
  scalar = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_1d8,local_1f8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_200,&scalar);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d8,0);
  local_db9 = false;
  if (sVar5 == 1) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_1d8);
    local_db9 = false;
    if (sVar5 == 1) {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_1d8,0);
      local_db9 = *piVar6 == this->scalar_;
    }
  }
  local_205 = local_db9;
  test(&local_205);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_1d8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_188);
  shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_3.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228,1,
             (allocator_type *)&m_3.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_3.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228,0);
  *pvVar2 = 0x18;
  std::allocator<int>::allocator(&local_279);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_278,
             (int *)((long)&shape_3.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4),
             &andres::defaultOrder,&local_279);
  std::allocator<int>::~allocator(&local_279);
  local_288._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228);
  local_290 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228);
  i = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_278,local_288,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_290,&i);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_278,0);
  local_de9 = false;
  if (sVar5 == 0x18) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_278);
    local_de9 = false;
    if (sVar5 == 0x18) {
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_278);
      local_de9 = sVar5 == 1;
    }
  }
  local_295 = local_de9;
  test(&local_295);
  piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                     ((View<int,false,std::allocator<unsigned_long>> *)local_278,0);
  local_296 = *piVar6 == 1;
  test(&local_296);
  for (shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0x18;
      shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_278,
                        shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = *piVar6 == 3;
    test((bool *)((long)&shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_278);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_228);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_4.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b8,1,
             (allocator_type *)&m_4.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_4.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b8,0);
  *pvVar2 = 0xc;
  local_310._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b8);
  local_318._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b8);
  local_31c = LastMajorOrder;
  std::allocator<int>::allocator(&local_31d);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_308,local_310,local_318,
             &this->scalar_,&local_31c,&local_31d);
  std::allocator<int>::~allocator(&local_31d);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b8,0);
  *pvVar2 = 0x18;
  local_328._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b8);
  local_330 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b8);
  i_1 = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_308,local_328,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_330,&i_1);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_308,0);
  local_e31 = false;
  if (sVar5 == 0x18) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_308);
    local_e31 = false;
    if (sVar5 == 0x18) {
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_308);
      local_e31 = sVar5 == 1;
    }
  }
  local_335 = local_e31;
  test(&local_335);
  for (scalar_1 = 0; scalar_1 < 0x18; scalar_1 = scalar_1 + 1) {
    if (scalar_1 < 0xc) {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_308,scalar_1);
      local_33d = *piVar6 == this->scalar_;
      test(&local_33d);
    }
    else {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_308,scalar_1);
      local_33e = *piVar6 == 3;
      test(&local_33e);
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_308);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b8);
  m_5._68_4_ = 1;
  paVar1 = (allocator<int> *)
           ((long)&newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,_std::allocator<unsigned_long>_>::Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_390,(int *)&m_5.field_0x44,
             &andres::defaultOrder,paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&newShape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator(&local_3b1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3b0,3,&local_3b1);
  std::allocator<unsigned_long>::~allocator(&local_3b1);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3b0,0);
  *pvVar2 = 5;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3b0,1);
  *pvVar2 = 5;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3b0,2);
  *pvVar2 = 2;
  local_3c0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3b0);
  local_3c8 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3b0);
  z = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_390,local_3c0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_3c8,&z);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_390,0);
  local_e71 = false;
  if (sVar5 == 5) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_390,1);
    local_e71 = false;
    if (sVar5 == 5) {
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_390,2);
      local_e71 = false;
      if (sVar5 == 2) {
        sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_390);
        local_e71 = false;
        if (sVar5 == 0x32) {
          sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_390);
          local_e71 = sVar5 == 3;
        }
      }
    }
  }
  y._3_1_ = local_e71;
  test((bool *)((long)&y + 3));
  for (x = 0; x < 2; x = x + 1) {
    for (local_3d8 = 0; local_3d8 < 5; local_3d8 = local_3d8 + 1) {
      for (shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < 5;
          shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        if (((local_3d8 == 0) && (x == 0)) &&
           (shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ == 0)) {
          piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)local_390,0,0,0);
          shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._3_1_ = *piVar6 == 1;
          test((bool *)((long)&shape_5.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
        }
        else {
          piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)local_390,
                              (long)shape_5.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              local_3d8,x);
          shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._2_1_ = *piVar6 == 3;
          test((bool *)((long)&shape_5.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
        }
      }
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3b0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_390);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_6.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3f8,1,
             (allocator_type *)&m_6.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_6.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3f8,0);
  *pvVar2 = 0xc;
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3f8);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3f8);
  newShape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  paVar1 = (allocator<int> *)
           ((long)&newShape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_448,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,&this->scalar_,
             (CoordinateOrder *)
             ((long)&newShape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&newShape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<unsigned_long>::allocator(&local_479);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_478,3,&local_479);
  std::allocator<unsigned_long>::~allocator(&local_479);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_478,0);
  *pvVar2 = 5;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_478,1);
  *pvVar2 = 5;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_478,2);
  *pvVar2 = 2;
  local_488._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_478);
  local_490 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_478);
  z_1 = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_448,local_488,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_490,&z_1);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_448,0);
  local_ed1 = false;
  if (sVar5 == 5) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_448,1);
    local_ed1 = false;
    if (sVar5 == 5) {
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_448,2);
      local_ed1 = false;
      if (sVar5 == 2) {
        sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_448);
        local_ed1 = false;
        if (sVar5 == 0x32) {
          sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_448);
          local_ed1 = sVar5 == 3;
        }
      }
    }
  }
  y_1._3_1_ = local_ed1;
  test((bool *)((long)&y_1 + 3));
  for (x_1 = 0; x_1 < 2; x_1 = x_1 + 1) {
    for (local_4a0 = 0; local_4a0 < 5; local_4a0 = local_4a0 + 1) {
      for (shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < 5;
          shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        if (((local_4a0 == 0) && (x_1 == 0)) &&
           (shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ < 5)) {
          piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)local_448,
                              (long)shape_6.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,0,0);
          shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._3_1_ = *piVar6 == this->scalar_;
          test((bool *)((long)&shape_6.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
        }
        else {
          piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)local_448,
                              (long)shape_6.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              local_4a0,x_1);
          shape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._2_1_ = *piVar6 == 3;
          test((bool *)((long)&shape_6.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
        }
      }
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_478);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_448);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3f8);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_7.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c0,2,
             (allocator_type *)&m_7.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_7.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c0,0);
  *pvVar2 = 6;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c0,1);
  *pvVar2 = 4;
  local_518._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c0);
  local_520._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c0);
  local_524 = LastMajorOrder;
  std::allocator<int>::allocator(&local_525);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_510,local_518,local_520,
             &this->scalar_,&local_524,&local_525);
  std::allocator<int>::~allocator(&local_525);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c0,0);
  *pvVar2 = 3;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c0,1);
  *pvVar2 = 2;
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c0);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c0);
  shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 6;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_510,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (int *)((long)&shape_7.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_510,0);
  local_f29 = false;
  if (sVar5 == 3) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_510,1);
    local_f29 = false;
    if (sVar5 == 2) {
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_510);
      local_f29 = false;
      if (sVar5 == 6) {
        sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_510);
        local_f29 = sVar5 == 2;
      }
    }
  }
  shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = local_f29;
  test((bool *)((long)&shape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_510);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4c0);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_8.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_558,2,
             (allocator_type *)&m_8.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_8.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_558,0);
  *pvVar2 = 3;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_558,1);
  *pvVar2 = 2;
  local_5b0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_558);
  local_5b8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_558);
  local_5bc = LastMajorOrder;
  std::allocator<int>::allocator(&local_5bd);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_5a8,local_5b0,local_5b8,
             &this->scalar_,&local_5bc,&local_5bd);
  std::allocator<int>::~allocator(&local_5bd);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_558,0);
  *pvVar2 = 6;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_558,1);
  *pvVar2 = 4;
  local_5c8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_558);
  local_5d0 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_558);
  y_2 = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_5a8,local_5c8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_5d0,&y_2);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_5a8,0);
  local_f69 = false;
  if (sVar5 == 6) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_5a8,1);
    local_f69 = false;
    if (sVar5 == 4) {
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_5a8);
      local_f69 = false;
      if (sVar5 == 0x18) {
        sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_5a8);
        local_f69 = sVar5 == 2;
      }
    }
  }
  x_2._3_1_ = local_f69;
  test((bool *)((long)&x_2 + 3));
  for (local_5dc = 0; local_5dc < 4; local_5dc = local_5dc + 1) {
    for (local_5e0 = 0; local_5e0 < 6; local_5e0 = local_5e0 + 1) {
      if ((local_5dc < 2) && (local_5e0 < 3)) {
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_5a8,
                            (long)local_5e0,local_5dc);
        shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = *piVar6 == this->scalar_;
        test((bool *)((long)&shape_8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      }
      else {
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_5a8,
                            (long)local_5e0,local_5dc);
        shape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._6_1_ = *piVar6 == 3;
        test((bool *)((long)&shape_8.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_5a8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_558);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_9.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_600,2,
             (allocator_type *)&m_9.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_9.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_600,0);
  *pvVar2 = 6;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_600,1);
  *pvVar2 = 4;
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_600);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_600);
  newShape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  paVar1 = (allocator<int> *)
           ((long)&newShape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_650,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,&this->scalar_,
             (CoordinateOrder *)
             ((long)&newShape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&newShape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<unsigned_long>::allocator(&local_681);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_680,0,&local_681);
  std::allocator<unsigned_long>::~allocator(&local_681);
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_680);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_680);
  shape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_650,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (int *)((long)&shape_9.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_680);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_650);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_600);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_10.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6b8,2,
             (allocator_type *)&m_10.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_10.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6b8,0);
  *pvVar2 = 6;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6b8,1);
  *pvVar2 = 4;
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6b8);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6b8);
  newShape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  paVar1 = (allocator<int> *)
           ((long)&newShape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_708,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,&this->scalar_,
             (CoordinateOrder *)
             ((long)&newShape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&newShape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<unsigned_long>::allocator(&local_739);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_738,1,&local_739);
  std::allocator<unsigned_long>::~allocator(&local_739);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_738,0);
  *pvVar2 = 0xc;
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_738);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_738);
  shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_708,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (int *)((long)&shape_10.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_708,0);
  local_fe9 = false;
  if (sVar5 == 0xc) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_708);
    local_fe9 = sVar5 == 0xc;
  }
  shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = local_fe9;
  test((bool *)((long)&shape_10.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_738);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_708);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_6b8);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_11.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_770,2,
             (allocator_type *)&m_11.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_11.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_770,0);
  *pvVar2 = 6;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_770,1);
  *pvVar2 = 4;
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_770);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_770);
  newShape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  paVar1 = (allocator<int> *)
           ((long)&newShape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_7c0,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,&this->scalar_,
             (CoordinateOrder *)
             ((long)&newShape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&newShape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<unsigned_long>::allocator(&local_7f1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7f0,1,&local_7f1);
  std::allocator<unsigned_long>::~allocator(&local_7f1);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7f0,0);
  *pvVar2 = 0xc;
  local_800._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7f0);
  local_808 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7f0);
  i_2 = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_7c0,local_800,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_808,&i_2);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_7c0,0);
  local_1021 = false;
  if (sVar5 == 0xc) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_7c0);
    local_1021 = false;
    if (sVar5 == 0xc) {
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_7c0);
      local_1021 = sVar5 == 1;
    }
  }
  local_80d = local_1021;
  test(&local_80d);
  for (i_3 = 0; i_3 < 6; i_3 = i_3 + 1) {
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_7c0,i_3);
    local_815 = *piVar6 == this->scalar_;
    test(&local_815);
  }
  for (shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 6;
      shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0xc;
      shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_7c0,
                        shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = *piVar6 == 3;
    test((bool *)((long)&shape_11.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_7f0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_7c0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_770);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_12.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_838,2,
             (allocator_type *)&m_12.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_12.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_838,0);
  *pvVar2 = 3;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_838,1);
  *pvVar2 = 2;
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_838);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_838);
  newShape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  paVar1 = (allocator<int> *)
           ((long)&newShape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_888,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,&this->scalar_,
             (CoordinateOrder *)
             ((long)&newShape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&newShape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<unsigned_long>::allocator(&local_8b9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8b8,3,&local_8b9);
  std::allocator<unsigned_long>::~allocator(&local_8b9);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8b8,0);
  *pvVar2 = 5;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8b8,1);
  *pvVar2 = 5;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8b8,2);
  *pvVar2 = 2;
  local_8c8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8b8);
  local_8d0 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8b8);
  z_2 = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_888,local_8c8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_8d0,&z_2);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_888,0);
  local_1071 = false;
  if (sVar5 == 5) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_888,1);
    local_1071 = false;
    if (sVar5 == 5) {
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_888,2);
      local_1071 = false;
      if (sVar5 == 2) {
        sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_888);
        local_1071 = false;
        if (sVar5 == 0x32) {
          sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_888);
          local_1071 = sVar5 == 3;
        }
      }
    }
  }
  y_3._3_1_ = local_1071;
  test((bool *)((long)&y_3 + 3));
  for (x_3 = 0; x_3 < 2; x_3 = x_3 + 1) {
    for (local_8e0 = 0; local_8e0 < 5; local_8e0 = local_8e0 + 1) {
      for (shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < 5;
          shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        if (((local_8e0 < 2) && (x_3 == 0)) &&
           (shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ < 3)) {
          piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)local_888,
                              (long)shape_12.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              local_8e0,0);
          shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._3_1_ = *piVar6 == this->scalar_;
          test((bool *)((long)&shape_12.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
        }
        else {
          piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)local_888,
                              (long)shape_12.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              local_8e0,x_3);
          shape_12.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._2_1_ = *piVar6 == 3;
          test((bool *)((long)&shape_12.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
        }
      }
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_8b8);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_888);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_838);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_13.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_900,3,
             (allocator_type *)&m_13.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_13.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_900,0);
  *pvVar2 = 3;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_900,1);
  *pvVar2 = 4;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_900,2);
  *pvVar2 = 2;
  local_958._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_900);
  local_960._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_900);
  local_964 = LastMajorOrder;
  std::allocator<int>::allocator(&local_965);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_950,local_958,local_960,
             &this->scalar_,&local_964,&local_965);
  std::allocator<int>::~allocator(&local_965);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_900,0);
  *pvVar2 = 2;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_900,1);
  *pvVar2 = 2;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_900,2);
  *pvVar2 = 2;
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_900);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_900);
  shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 8;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_950,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (int *)((long)&shape_13.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_950,0);
  local_10c9 = false;
  if (sVar5 == 2) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_950,1);
    local_10c9 = false;
    if (sVar5 == 2) {
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_950,2);
      local_10c9 = false;
      if (sVar5 == 2) {
        sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_950);
        local_10c9 = false;
        if (sVar5 == 8) {
          sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_950);
          local_10c9 = sVar5 == 3;
        }
      }
    }
  }
  shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = local_10c9;
  test((bool *)((long)&shape_13.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_950);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_900);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_14.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_998,3,
             (allocator_type *)&m_14.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_14.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_998,0);
  *pvVar2 = 3;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_998,1);
  *pvVar2 = 4;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_998,2);
  *pvVar2 = 2;
  local_9f0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_998);
  local_9f8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_998);
  local_9fc = LastMajorOrder;
  std::allocator<int>::allocator(&local_9fd);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_9e8,local_9f0,local_9f8,
             &this->scalar_,&local_9fc,&local_9fd);
  std::allocator<int>::~allocator(&local_9fd);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_998,0);
  *pvVar2 = 5;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_998,1);
  *pvVar2 = 5;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_998,2);
  *pvVar2 = 2;
  local_a08._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_998);
  local_a10 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_998);
  z_3 = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_9e8,local_a08,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_a10,&z_3);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9e8,0);
  local_1111 = false;
  if (sVar5 == 5) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9e8,1);
    local_1111 = false;
    if (sVar5 == 5) {
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9e8,2);
      local_1111 = false;
      if (sVar5 == 2) {
        sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9e8);
        local_1111 = false;
        if (sVar5 == 0x32) {
          sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_9e8);
          local_1111 = sVar5 == 3;
        }
      }
    }
  }
  y_4._3_1_ = local_1111;
  test((bool *)((long)&y_4 + 3));
  for (x_4 = 0; x_4 < 2; x_4 = x_4 + 1) {
    for (local_a20 = 0; local_a20 < 5; local_a20 = local_a20 + 1) {
      for (shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
          shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ < 5;
          shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
        if ((local_a20 < 4) &&
           (shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ < 3)) {
          piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)local_9e8,
                              (long)shape_14.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              local_a20,x_4);
          shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._3_1_ = *piVar6 == this->scalar_;
          test((bool *)((long)&shape_14.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
        }
        else {
          piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                             ((View<int,false,std::allocator<unsigned_long>> *)local_9e8,
                              (long)shape_14.
                                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                              local_a20,x_4);
          shape_14.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._2_1_ = *piVar6 == 3;
          test((bool *)((long)&shape_14.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage + 2));
        }
      }
    }
  }
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_9e8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_998);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_15.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a40,3,
             (allocator_type *)&m_15.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_15.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a40,0);
  *pvVar2 = 3;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a40,1);
  *pvVar2 = 4;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a40,2);
  *pvVar2 = 2;
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a40);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a40);
  newShape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  paVar1 = (allocator<int> *)
           ((long)&newShape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_a90,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,&this->scalar_,
             (CoordinateOrder *)
             ((long)&newShape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&newShape_6.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<unsigned_long>::allocator(&local_ac1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ac0,0,&local_ac1);
  std::allocator<unsigned_long>::~allocator(&local_ac1);
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ac0);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ac0);
  shape_15.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_a90,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (int *)((long)&shape_15.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_ac0);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_a90);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a40);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_16.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_af8,3,
             (allocator_type *)&m_16.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_16.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_af8,0);
  *pvVar2 = 3;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_af8,1);
  *pvVar2 = 4;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_af8,2);
  *pvVar2 = 2;
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_af8);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_af8);
  newShape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  paVar1 = (allocator<int> *)
           ((long)&newShape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_b48,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,&this->scalar_,
             (CoordinateOrder *)
             ((long)&newShape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&newShape_7.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<unsigned_long>::allocator(&local_b79);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b78,1,&local_b79);
  std::allocator<unsigned_long>::~allocator(&local_b79);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b78,0);
  *pvVar2 = 0xc;
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b78);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b78);
  shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_b48,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,
             (int *)((long)&shape_16.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b48,0);
  local_1199 = false;
  if (sVar5 == 0xc) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_b48);
    local_1199 = false;
    if (sVar5 == 0xc) {
      piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                         ((View<int,false,std::allocator<unsigned_long>> *)local_b48,0);
      local_1199 = *piVar6 == this->scalar_;
    }
  }
  shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._3_1_ = local_1199;
  test((bool *)((long)&shape_16.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_b78);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_b48);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_af8);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_17.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bb0,3,
             (allocator_type *)&m_17.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_17.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bb0,0);
  *pvVar2 = 3;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bb0,1);
  *pvVar2 = 4;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bb0,2);
  *pvVar2 = 2;
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bb0);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bb0);
  newShape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  paVar1 = (allocator<int> *)
           ((long)&newShape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_c00,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,&this->scalar_,
             (CoordinateOrder *)
             ((long)&newShape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&newShape_8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<unsigned_long>::allocator(&local_c31);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c30,1,&local_c31);
  std::allocator<unsigned_long>::~allocator(&local_c31);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c30,0);
  *pvVar2 = 0xc;
  local_c40._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c30);
  local_c48 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c30);
  i_4 = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_c00,local_c40,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_c48,&i_4);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c00,0);
  local_11d9 = false;
  if (sVar5 == 0xc) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c00);
    local_11d9 = false;
    if (sVar5 == 0xc) {
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_c00);
      local_11d9 = sVar5 == 1;
    }
  }
  local_c4d = local_11d9;
  test(&local_c4d);
  for (i_5 = 0; i_5 < 3; i_5 = i_5 + 1) {
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_c00,i_5);
    local_c55 = *piVar6 == this->scalar_;
    test(&local_c55);
  }
  for (shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
      shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ < 0xc;
      shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                       ((View<int,false,std::allocator<unsigned_long>> *)local_c00,
                        shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._3_1_ = *piVar6 == 3;
    test((bool *)((long)&shape_17.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c30);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_c00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_bb0);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)&m_18.field_0x47);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c78,3,
             (allocator_type *)&m_18.field_0x47);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&m_18.field_0x47);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c78,0);
  *pvVar2 = 3;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c78,1);
  *pvVar2 = 4;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c78,2);
  *pvVar2 = 2;
  iVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c78);
  iVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c78);
  newShape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  paVar1 = (allocator<int> *)
           ((long)&newShape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  std::allocator<int>::allocator(paVar1);
  andres::Marray<int,std::allocator<unsigned_long>>::
  Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_cc8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar3._M_current,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iVar4._M_current,&this->scalar_,
             (CoordinateOrder *)
             ((long)&newShape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 4),paVar1);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&newShape_9.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<unsigned_long>::allocator(&local_cf9);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_cf8,2,&local_cf9);
  std::allocator<unsigned_long>::~allocator(&local_cf9);
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_cf8,0);
  *pvVar2 = 6;
  pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_cf8,1);
  *pvVar2 = 4;
  local_d08._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_cf8);
  local_d10 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_cf8);
  y_5 = 3;
  andres::Marray<int,std::allocator<unsigned_long>>::
  resize<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Marray<int,std::allocator<unsigned_long>> *)local_cc8,local_d08,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )local_d10,&y_5);
  sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                    ((View<int,_false,_std::allocator<unsigned_long>_> *)local_cc8,0);
  local_1229 = false;
  if (sVar5 == 6) {
    sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::shape
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_cc8,1);
    local_1229 = false;
    if (sVar5 == 4) {
      sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                        ((View<int,_false,_std::allocator<unsigned_long>_> *)local_cc8);
      local_1229 = false;
      if (sVar5 == 0x18) {
        sVar5 = andres::View<int,_false,_std::allocator<unsigned_long>_>::dimension
                          ((View<int,_false,_std::allocator<unsigned_long>_> *)local_cc8);
        local_1229 = sVar5 == 2;
      }
    }
  }
  x_5._3_1_ = local_1229;
  test((bool *)((long)&x_5 + 3));
  for (local_d1c = 0; local_d1c < 4; local_d1c = local_d1c + 1) {
    for (local_d20 = 0; local_d20 < 6; local_d20 = local_d20 + 1) {
      if ((local_d1c < 4) && (local_d20 < 3)) {
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_cc8,
                            (long)local_d20,local_d1c);
        local_d21 = *piVar6 == this->scalar_;
        test(&local_d21);
      }
      else {
        piVar6 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_cc8,
                            (long)local_d20,local_d1c);
        local_d22 = *piVar6 == 3;
        test(&local_d22);
      }
    }
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_cf8);
  andres::Marray<int,_std::allocator<unsigned_long>_>::~Marray
            ((Marray<int,_std::allocator<unsigned_long>_> *)local_cc8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_c78);
  return;
}

Assistant:

void MarrayTest::resizeTest() {
    // 1D
    {
        // shrink
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 12; 
            m.resize(shape.begin(), shape.end(), 12);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m.dimension()==1);
        }
        // shrink to dimension == 0 
        {
            std::vector<std::size_t> shape(1), shape0(0);
            shape[0] = 24; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            m.resize(shape0.begin(), shape0.end(), 1);
        }
        // shrink to scalar 
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 1; 
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==1 &&
                   m.size()==1 && 
                   m(0) == scalar_);
        }
        // grow scalar to 1D
        {
            int scalar = 1;
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::Marray<int> m(scalar);
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==24 &&
                   m.size()==24 &&
                   m.dimension() == 1);
            test(m(0) == 1);
            for(int i = 1; i < 24; ++i){
                test(m(i) == 3);
            }
        }
        // grow 1D
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 12; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 24; 
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==24 &&
                   m.size()==24 &&
                   m.dimension()==1);
            for(int i = 0; i < 24; ++i){
                if(i < 12) {
                    test(m(i) == scalar_);
                }
                else {
                    test(m(i) == 3); 
                }
            }
        }
        // grow scalar to 3D
        {
            int scalar = 1;
            andres::Marray<int> m(scalar); 
            std::vector<std::size_t> newShape(3);
            newShape[0] = 5;
            newShape[1] = 5; 
            newShape[2] = 2;
            m.resize(newShape.begin(), newShape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y){
                for(int x = 0; x < 5; ++x){
                    if(y == 0 && z == 0 && x == 0) {
                        test(m(x, y, z) == 1);
                    }
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
        // grow to 3D
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 12; 
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder); 
            std::vector<std::size_t> newShape(3);
            newShape[0] = 5;
            newShape[1] = 5; 
            newShape[2] = 2;
            m.resize(newShape.begin(), newShape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y) {
                for(int x = 0; x < 5; ++x) {
                    if(y == 0 && z == 0 && x < 5) {
                        test(m(x, y, z) == scalar_);
                    }
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
    }
    // 2D 
    {
        // shrink
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 3; 
            shape[1] = 2; 
            m.resize(shape.begin(), shape.end(), 6);

            test(m.shape(0)==3 &&
                   m.shape(1)==2 &&
                   m.size()==6 &&
                   m.dimension()==2);
        }
        // grow
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 3; 
            shape[1] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 6; 
            shape[1] = 4; 
            m.resize(shape.begin(), shape.end(), 3);

            test(m.shape(0)==6 &&
                   m.shape(1)==4 &&
                   m.size()==24 &&
                   m.dimension()==2);
            for(int y = 0; y < 4; ++y){
                for(int x = 0; x < 6; ++x){
                    if(y < 2 && x < 3) {
                        test(m(x, y) == scalar_);
                    }
                    else {
                        test(m(x, y) == 3);
                    }
                }
            }
        }
        // shrink to dimension == 0
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(0); 
            m.resize(newShape.begin(), newShape.end(), 3);
        }
        // shrink to scalar
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;

            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12);
        }
        // shrink to 1D
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 6; 
            shape[1] = 4;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m.dimension()==1);
            for(int i = 0; i < 6; ++i)
                test(m(i) == scalar_);
            for(int i = 6; i < 12; ++i)
                test(m(i) == 3);
        }
        // grow to 3D
        {
            std::vector<std::size_t> shape(2); 
            shape[0] = 3; 
            shape[1] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(3);
            newShape[0] = 5;
            newShape[1] = 5; 
            newShape[2] = 2;
            m.resize(newShape.begin(), newShape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y){
                for(int x = 0; x < 5; ++x){
                    if(y < 2 && z == 0 && x < 3) {
                        test(m(x, y, z) == scalar_);
                    }
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
    }
    // 3D
    {
        // shrink
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 2;
            shape[1] = 2; 
            shape[2] = 2;
            m.resize(shape.begin(), shape.end(), 8);
        
            test(m.shape(0)==2 &&
                   m.shape(1)==2 &&
                   m.shape(2)==2 &&
                   m.size()==8 &&
                   m.dimension()==3);
        }
        // grow
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            shape[0] = 5;
            shape[1] = 5; 
            shape[2] = 2;
            m.resize(shape.begin(), shape.end(), 3);
        
            test(m.shape(0)==5 &&
                   m.shape(1)==5 &&
                   m.shape(2)==2 &&
                   m.size()==50 &&
                   m.dimension()==3);
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 5; ++y){
                for(int x = 0; x < 5; ++x){
                    if(y < 4 && x < 3) {
                        test(m(x, y, z) == scalar_);
                    }                   
                    else {
                        test(m(x, y, z) == 3);
                    }
                }
            }
        }
        // shrink to dimension == 0
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(0); 
            m.resize(newShape.begin(), newShape.end(), 3);
        }
        // shrink to scalar
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m(0) == scalar_);
        }
        // shrink to 1D
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(1); 
            newShape[0] = 12; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==12 &&
                   m.size()==12 &&
                   m.dimension()==1);
            for(int i = 0; i < 3; ++i)
                test(m(i) == scalar_);
            for(int i = 3; i < 12; ++i)
                test(m(i) == 3);
        }
        // shrink to 2D
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2;
            andres::Marray<int> m(shape.begin(), shape.end(), scalar_, coordinateOrder);
            std::vector<std::size_t> newShape(2); 
            newShape[0] = 6; 
            newShape[1] = 4; 
            m.resize(newShape.begin(), newShape.end(), 3);

            test(m.shape(0)==6 &&
                   m.shape(1)==4 &&
                   m.size()==24 &&
                   m.dimension()==2);
            for(int y = 0; y < 4; ++y){
                for(int x = 0; x < 6; ++x){
                    if(y < 4 && x < 3) {
                        test(m(x, y) == scalar_);
                    }
                    else {
                        test(m(x, y) == 3);
                    }
                }
            }
        }
    }
}